

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * Cudd_bddCompose(DdManager *dd,DdNode *f,DdNode *g,int v)

{
  DdNode *proj_00;
  DdNode *res;
  DdNode *proj;
  int v_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if ((v < 0) || (dd->size <= v)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    proj_00 = dd->vars[v];
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)cuddBddComposeRecur(dd,f,g,proj_00);
    } while (dd->reordered == 1);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddCompose(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  int  v)
{
    DdNode *proj, *res;

    /* Sanity check. */
    if (v < 0 || v >= dd->size) return(NULL);

    proj =  dd->vars[v];
    do {
        dd->reordered = 0;
        res = cuddBddComposeRecur(dd,f,g,proj);
    } while (dd->reordered == 1);
    return(res);

}